

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,ip_filter *a)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined1 local_e0 [32];
  ip_filter local_c0;
  error_code_enum local_4c;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  ip_filter *a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RCX;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    local_4c = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_4c);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  ctx = libtorrent::aux::session_impl::get_context(this_00);
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_e0,
             (shared_ptr<libtorrent::aux::session_impl> *)local_48);
  local_e0._16_8_ = f;
  local_e0._24_8_ = a;
  ip_filter::ip_filter
            (&local_c0,
             (ip_filter *)
             s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&)const::_lambda()_1_>
            (ctx,(type_conflict15 *)local_e0,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_e0);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_48);
  return;
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}